

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WirehairCodec.cpp
# Opt level: O1

WirehairResult __thiscall wirehair::Codec::EncodeFeed(Codec *this,void *message_in)

{
  bool bVar1;
  WirehairResult WVar2;
  uint row_seed;
  bool bVar3;
  
  if (message_in == (void *)0x0) {
    return Wirehair_InvalidInput;
  }
  if ((this->_input_allocated != 0) && (this->_input_blocks != (uint8_t *)0x0)) {
    SIMDSafeFree(this->_input_blocks);
    this->_input_blocks = (uint8_t *)0x0;
  }
  this->_input_allocated = 0;
  this->_input_blocks = (uint8_t *)message_in;
  bVar3 = this->_block_count != 0;
  if (bVar3) {
    bVar1 = OpportunisticPeeling(this,0,0);
    if (bVar1) {
      row_seed = 1;
      do {
        bVar3 = row_seed < this->_block_count;
        if (!bVar3) goto LAB_00109c45;
        bVar1 = OpportunisticPeeling(this,(uint16_t)row_seed,row_seed);
        row_seed = row_seed + 1;
      } while (bVar1);
    }
    if (bVar3) {
      return Wirehair_BadPeelSeed;
    }
  }
LAB_00109c45:
  WVar2 = SolveMatrix(this);
  if (WVar2 == Wirehair_NeedMore) {
    WVar2 = Wirehair_BadPeelSeed;
  }
  else if (WVar2 == Wirehair_Success) {
    GenerateRecoveryBlocks(this);
    WVar2 = Wirehair_Success;
  }
  return WVar2;
}

Assistant:

WirehairResult Codec::EncodeFeed(const void * GF256_RESTRICT message_in)
{
    CAT_IF_DUMP(cout << endl << "---- EncodeFeed ----" << endl << endl;)

    // Validate input
    if (message_in == nullptr) {
        return Wirehair_InvalidInput;
    }

    SetInput(message_in);

    // For each input row:
    for (uint16_t id = 0; id < _block_count; ++id) {
        if (!OpportunisticPeeling(id, id)) {
            return Wirehair_BadPeelSeed;
        }
    }

    // Solve matrix and generate recovery blocks
    WirehairResult result = SolveMatrix();

    if (result == Wirehair_Success) {
        GenerateRecoveryBlocks();
        return Wirehair_Success;
    }
    else if (result == Wirehair_NeedMore) {
        return Wirehair_BadPeelSeed;
    }
    else {
        return result;
    }
}